

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall chrono::robosimian::RoboSimian::Initialize(RoboSimian *this,ChCoordsys<double> *pos)

{
  RS_Sled *this_00;
  element_type *peVar1;
  RS_Limb *pRVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  double *pdVar9;
  ulong uVar10;
  string *psVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ChVector<double> local_148;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ChVector<double> local_108;
  long lStack_f0;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  shared_ptr<chrono::ChBodyAuxRef> local_80;
  shared_ptr<chrono::ChBodyAuxRef> local_70;
  shared_ptr<chrono::ChBodyAuxRef> local_60;
  shared_ptr<chrono::ChBodyAuxRef> local_50;
  shared_ptr<chrono::ChBodyAuxRef> local_40;
  
  RS_Chassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos);
  this_00 = (this->m_sled).
            super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RS_Sled *)0x0) {
    peVar1 = (this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar1->super_RS_Part).m_body.
         super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar1->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_108.m_data[0] = 0.0;
    local_108.m_data[1] = 0.0;
    local_108.m_data[2] = 0.21;
    local_148.m_data[0] = 1.570796;
    local_148.m_data[1] = 0.0;
    local_148.m_data[2] = 0.0;
    RS_Sled::Initialize(this_00,&local_40,&local_108,&local_148);
    if (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar2 = (((this->m_limbs).
             super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_108.m_data[0] = 0.29326;
  local_108.m_data[1] = 0.2094;
  local_108.m_data[2] = 0.0365;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = -1.5708;
  local_148.m_data[2] = -0.2618;
  RS_Limb::Initialize(pRVar2,&local_50,&local_108,&local_148,LIMB_FR,this->m_wheel_mode);
  if (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar2 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_108.m_data[0] = -0.29326;
  local_108.m_data[1] = 0.2094;
  local_108.m_data[2] = 0.0365;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = -1.5708;
  local_148.m_data[2] = 0.2618;
  RS_Limb::Initialize(pRVar2,&local_60,&local_108,&local_148,LIMB_RR,this->m_wheel_mode);
  if (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar2 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_108.m_data[0] = -0.29326;
  local_108.m_data[1] = -0.2094;
  local_108.m_data[2] = 0.0365;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = -1.5708;
  local_148.m_data[2] = 2.87979;
  RS_Limb::Initialize(pRVar2,&local_70,&local_108,&local_148,LIMB_RL,this->m_wheel_mode);
  if (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar2 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_RS_Part).m_body.
       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_108.m_data[0] = 0.29326;
  local_108.m_data[1] = -0.2094;
  local_108.m_data[2] = 0.0365;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = -1.5708;
  local_148.m_data[2] = 3.40339;
  RS_Limb::Initialize(pRVar2,&local_80,&local_108,&local_148,LIMB_FL,this->m_wheel_mode);
  if (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  psVar11 = (string *)&this->field_0x108;
  lVar12 = 0;
  do {
    local_c0[0] = local_b0;
    pcVar3 = (this->m_outdir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar3,pcVar3 + (this->m_outdir)._M_string_length);
    std::__cxx11::string::append((char *)local_c0);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_c0,(ulong)(this->m_root)._M_dataplus._M_p);
    local_a0 = &local_90;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_90 = *plVar7;
      lStack_88 = plVar5[3];
    }
    else {
      local_90 = *plVar7;
      local_a0 = (long *)*plVar5;
    }
    local_98 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_d0 = *puVar8;
      lStack_c8 = plVar5[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *puVar8;
      local_e0 = (ulong *)*plVar5;
    }
    local_d8 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_128 = local_118;
    std::__cxx11::string::_M_construct((ulong)&local_128,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128,1,(uint)lVar12);
    uVar10 = 0xf;
    if (local_e0 != &local_d0) {
      uVar10 = local_d0;
    }
    if (uVar10 < (ulong)(local_120 + local_d8)) {
      uVar10 = 0xf;
      if (local_128 != local_118) {
        uVar10 = local_118[0];
      }
      if (uVar10 < (ulong)(local_120 + local_d8)) goto LAB_00140ec2;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_00140ec2:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_128);
    }
    local_148.m_data[0] = (double)(local_148.m_data + 2);
    pdVar9 = (double *)(puVar6 + 2);
    if ((double *)*puVar6 == pdVar9) {
      local_148.m_data[2] = *pdVar9;
      uStack_130 = puVar6[3];
    }
    else {
      local_148.m_data[2] = *pdVar9;
      local_148.m_data[0] = (double)*puVar6;
    }
    local_148.m_data[1] = (double)puVar6[1];
    *puVar6 = pdVar9;
    puVar6[1] = 0;
    *(undefined1 *)pdVar9 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
    pdVar9 = (double *)(plVar5 + 2);
    if ((double *)*plVar5 == pdVar9) {
      local_108.m_data[2] = *pdVar9;
      lStack_f0 = plVar5[3];
      local_108.m_data[0] = (double)(local_108.m_data + 2);
    }
    else {
      local_108.m_data[2] = *pdVar9;
      local_108.m_data[0] = (double)*plVar5;
    }
    local_108.m_data[1] = (double)plVar5[1];
    *plVar5 = (long)pdVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::ofstream::open(psVar11,(_Ios_Openmode)&local_108);
    if ((double *)local_108.m_data[0] != local_108.m_data + 2) {
      operator_delete((void *)local_108.m_data[0],(long)local_108.m_data[2] + 1);
    }
    if ((double *)local_148.m_data[0] != local_148.m_data + 2) {
      operator_delete((void *)local_148.m_data[0],(long)local_148.m_data[2] + 1);
    }
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    lVar4 = *(long *)psVar11;
    *(undefined8 *)(psVar11 + *(long *)(lVar4 + -0x18) + 8) = 7;
    lVar4 = *(long *)(lVar4 + -0x18);
    *(uint *)(psVar11 + lVar4 + 0x18) = *(uint *)(psVar11 + lVar4 + 0x18) & 0xfffffefb | 0x100;
    lVar12 = lVar12 + 1;
    psVar11 = psVar11 + 0x200;
    if (lVar12 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void RoboSimian::Initialize(const ChCoordsys<>& pos) {
    m_chassis->Initialize(pos);

    if (m_sled)
        m_sled->Initialize(m_chassis->m_body, ChVector<>(0.0, 0.0, 0.21), ChVector<>(1.570796, 0, 0));

    m_limbs[FR]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, -0.26180), CollisionFamily::LIMB_FR, m_wheel_mode);
    m_limbs[RR]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, +0.26180), CollisionFamily::LIMB_RR, m_wheel_mode);
    m_limbs[RL]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 2.87979), CollisionFamily::LIMB_RL, m_wheel_mode);
    m_limbs[FL]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 3.40339), CollisionFamily::LIMB_FL, m_wheel_mode);

    ////m_wheel_left->Initialize(m_chassis->m_body, ChVector<>(-0.42943, -0.19252, 0.06380),
    ////                         ChVector<>(0.00000, +1.57080, -1.57080));
    ////m_wheel_right->Initialize(m_chassis->m_body, ChVector<>(-0.42943, +0.19252, 0.06380),
    ////                          ChVector<>(0.00000, -1.57080, -1.57080));

    // Create output files
    for (int i = 0; i < 4; i++) {
        m_outf[i].open(m_outdir + "/" + m_root + "_limb" + std::to_string(i) + ".dat");
        m_outf[i].precision(7);
        m_outf[i] << std::scientific;
    }
}